

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

_Bool cave_find_get_grid(loc *grid,int *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  wchar_t k;
  wchar_t j;
  int *state_local;
  loc *grid_local;
  
  if (state[4] < 0) {
    __assert_fail("state[4] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-util.c"
                  ,0xd0,"_Bool cave_find_get_grid(struct loc *, int *)");
  }
  iVar2 = state[4];
  iVar1 = *state;
  if (iVar2 < iVar1) {
    uVar4 = Rand_div(*state - state[4]);
    iVar3 = state[(int)(uVar4 + state[4] + 5)];
    state[(int)(uVar4 + state[4] + 5)] = state[state[4] + 5];
    state[state[4] + 5] = iVar3;
    grid->y = iVar3 / state[1] + state[3];
    grid->x = iVar3 % state[1] + state[2];
    state[4] = state[4] + 1;
  }
  return iVar2 < iVar1;
}

Assistant:

bool cave_find_get_grid(struct loc *grid, int *state)
{
	int j, k;

	assert(state[4] >= 0);
	if (state[4] >= state[0]) return false;

	/*
	 * Choose one of the remaining ones at random.  Swap it with the one
	 * that's next in order.
	 */
	j = randint0(state[0] - state[4]) + state[4];
	k = state[5 + j];
	state[5 + j] = state[5 + state[4]];
	state[5 + state[4]] = k;

	grid->y = (k / state[1]) + state[3];
	grid->x = (k % state[1]) + state[2];

	/*
	 * Increment so a future call to cave_find_get_grid() will get the
	 * next one.
	 */
	++state[4];
	return true;
}